

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::DestinationCast_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  BaseType BVar1;
  undefined1 local_50 [32];
  string local_30;
  
  BVar1 = type->base_type;
  if ((BVar1 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) &&
     ((0x64000U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    local_50._0_4_ = type->element;
    local_50._24_2_ = type->fixed_length;
    local_50._4_4_ = BASE_TYPE_NONE;
    local_50._8_8_ = type->struct_def;
    local_50._16_8_ = type->enum_def;
    DestinationCast_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_50);
  }
  else if (BVar1 - BASE_TYPE_UTYPE < 10 && type->enum_def != (EnumDef *)0x0) {
    NamespacedName_abi_cxx11_(&local_30,this,&type->enum_def->super_Definition);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,"("
                   ,&local_30);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,")"
                  );
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DestinationCast(const Type &type) const {
    if (IsSeries(type)) {
      return DestinationCast(type.VectorType());
    } else {
      if (IsEnum(type)) return "(" + NamespacedName(*type.enum_def) + ")";
    }
    return "";
  }